

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

address __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::get_address(iterator_base<true> *this)

{
  const_reference this_00;
  address aVar1;
  
  if ((this->visited_parents_).elements_ == 0) {
    assert_failed("visited_parents_.size () >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0xba);
  }
  this_00 = array_stack<pstore::index::details::parent_type,_13UL>::top(&this->visited_parents_);
  if ((((ulong)this_00->node & 1) == 0) && (this_00->position == 0xffffffffffffffff)) {
    aVar1 = details::index_pointer::to_address((index_pointer *)this_00);
    return (address)aVar1.a_;
  }
  assert_failed("parent.node.is_leaf () && parent.position == details::not_found",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0xbc);
}

Assistant:

address get_address () const {
                    PSTORE_ASSERT (visited_parents_.size () >= 1);
                    details::parent_type const & parent = visited_parents_.top ();
                    PSTORE_ASSERT (parent.node.is_leaf () && parent.position == details::not_found);
                    return parent.node.to_address ();
                }